

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O2

void V_Init2(void)

{
  uint32 *puVar1;
  undefined4 uVar2;
  DFrameBuffer *pDVar3;
  bool bVar4;
  int iVar5;
  DFrameBuffer *s;
  int height;
  int width;
  
  bVar4 = DObject::IsKindOf((DObject *)screen,DDummyFrameBuffer::RegistrationInfo.MyClass);
  pDVar3 = screen;
  if (bVar4) {
    width = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    height = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    uVar2 = *(undefined4 *)&screen[1].super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject;
    screen = (DFrameBuffer *)0x0;
    puVar1 = &(pDVar3->super_DSimpleCanvas).super_DCanvas.super_DObject.ObjectFlags;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    (*(pDVar3->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[2])();
    I_InitGraphics();
    I_ClosestResolution(&width,&height,8);
    iVar5 = (*Video->_vptr_IVideo[7])(Video,(ulong)(uint)width,(ulong)(uint)height,8);
    if ((char)iVar5 == '\0') {
      I_FatalError("Could not set resolution to %d x %d x %d",(ulong)(uint)width,(ulong)(uint)height
                   ,8);
    }
    else {
      Printf("Resolution: %d x %d\n",(ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
             (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Height);
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1d])(uVar2);
    (*Renderer->_vptr_FRenderer[5])();
    FBaseCVar::ResetColors();
    C_NewModeAdjust();
    M_InitVideoModesMenu();
    V_SetBorderNeedRefresh();
    setsizeneeded = true;
    return;
  }
  __assert_fail("screen->IsKindOf(RUNTIME_CLASS(DDummyFrameBuffer))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                ,0x61c,"void V_Init2()");
}

Assistant:

void V_Init2()
{
	assert (screen->IsKindOf(RUNTIME_CLASS(DDummyFrameBuffer)));
	int width = screen->GetWidth();
	int height = screen->GetHeight();
	float gamma = static_cast<DDummyFrameBuffer *>(screen)->Gamma;

	{
		DFrameBuffer *s = screen;
		screen = NULL;
		s->ObjectFlags |= OF_YesReallyDelete;
		delete s;
	}

	I_InitGraphics();
	I_ClosestResolution (&width, &height, 8);

	if (!Video->SetResolution (width, height, 8))
		I_FatalError ("Could not set resolution to %d x %d x %d", width, height, 8);
	else
		Printf ("Resolution: %d x %d\n", SCREENWIDTH, SCREENHEIGHT);

	screen->SetGamma (gamma);
	Renderer->RemapVoxels();
	FBaseCVar::ResetColors ();
	C_NewModeAdjust();
	M_InitVideoModesMenu();
	V_SetBorderNeedRefresh();
	setsizeneeded = true;
}